

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetDefaultLocalizedGMT
          (TimeZoneFormat *this,UnicodeString *text,int start,int32_t *parsedLen)

{
  short sVar1;
  int32_t iVar2;
  int8_t iVar3;
  int length;
  int32_t iVar4;
  int iVar5;
  int32_t iVar6;
  int iVar7;
  char16_t *pcVar8;
  uint uVar9;
  long lVar10;
  int start_00;
  char16_t cVar11;
  int32_t gmtLen;
  int32_t lenAbut;
  int32_t lenWithSep;
  int32_t local_38;
  int32_t local_34;
  
  lVar10 = 0;
  do {
    length = u_strlen_63((UChar *)(ALT_GMT_STRINGS + lVar10));
    iVar3 = UnicodeString::doCaseCompare
                      (text,start,length,(UChar *)(ALT_GMT_STRINGS + lVar10),0,length,0);
    if (iVar3 == '\0') break;
    lVar10 = lVar10 + 8;
    length = 0;
  } while (lVar10 != 0x18);
  iVar7 = 0;
  if (length != 0) {
    start_00 = length + start + 1;
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar9 = (text->fUnion).fFields.fLength;
    }
    else {
      uVar9 = (int)sVar1 >> 5;
    }
    if (start_00 < (int)uVar9) {
      cVar11 = L'\xffff';
      if ((uint)(start + length) < uVar9) {
        if (((int)sVar1 & 2U) == 0) {
          pcVar8 = (text->fUnion).fFields.fArray;
        }
        else {
          pcVar8 = (char16_t *)((long)&text->fUnion + 2);
        }
        cVar11 = pcVar8[start + length];
      }
      if (cVar11 == L'+') {
        iVar7 = 1;
      }
      else {
        iVar6 = 0;
        iVar7 = 0;
        if (cVar11 != L'-') goto LAB_0020a55f;
        iVar7 = -1;
      }
      local_34 = 0;
      iVar4 = parseDefaultOffsetFields(this,text,start_00,L':',&local_34);
      iVar2 = local_34;
      sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      local_38 = iVar2;
      iVar6 = iVar4;
      if (local_34 != iVar5 - start_00) {
        local_38 = 0;
        iVar6 = parseAbuttingOffsetFields(this,text,start_00,&local_38);
        if (local_38 < iVar2) {
          local_38 = iVar2;
          iVar6 = iVar4;
        }
      }
      iVar6 = iVar6 * iVar7;
      iVar7 = length + local_38 + 1;
      goto LAB_0020a55f;
    }
  }
  iVar6 = 0;
LAB_0020a55f:
  *parsedLen = iVar7;
  return iVar6;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetDefaultLocalizedGMT(const UnicodeString& text, int start, int32_t& parsedLen) const {
    int32_t idx = start;
    int32_t offset = 0;
    int32_t parsed = 0;

    do {
        // check global default GMT alternatives
        int32_t gmtLen = 0;

        for (int32_t i = 0; ALT_GMT_STRINGS[i][0] != 0; i++) {
            const UChar* gmt = ALT_GMT_STRINGS[i];
            int32_t len = u_strlen(gmt);
            if (text.caseCompare(start, len, gmt, 0) == 0) {
                gmtLen = len;
                break;
            }
        }
        if (gmtLen == 0) {
            break;
        }
        idx += gmtLen;

        // offset needs a sign char and a digit at minimum
        if (idx + 1 >= text.length()) {
            break;
        }

        // parse sign
        int32_t sign = 1;
        UChar c = text.charAt(idx);
        if (c == PLUS) {
            sign = 1;
        } else if (c == MINUS) {
            sign = -1;
        } else {
            break;
        }
        idx++;

        // offset part
        // try the default pattern with the separator first
        int32_t lenWithSep = 0;
        int32_t offsetWithSep = parseDefaultOffsetFields(text, idx, DEFAULT_GMT_OFFSET_SEP, lenWithSep);
        if (lenWithSep == text.length() - idx) {
            // maximum match
            offset = offsetWithSep * sign;
            idx += lenWithSep;
        } else {
            // try abutting field pattern
            int32_t lenAbut = 0;
            int32_t offsetAbut = parseAbuttingOffsetFields(text, idx, lenAbut);

            if (lenWithSep > lenAbut) {
                offset = offsetWithSep * sign;
                idx += lenWithSep;
            } else {
                offset = offsetAbut * sign;
                idx += lenAbut;
            }
        }
        parsed = idx - start;
    } while (false);

    parsedLen = parsed;
    return offset;
}